

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_zero(void *ptr,nk_size size)

{
  ulong uVar1;
  
  if (ptr == (void *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x18db,"void nk_zero(void *, nk_size)");
  }
  if (size < 0xc) {
    if (size != 0) {
LAB_0011d873:
      memset(ptr,0,size);
      return;
    }
  }
  else {
    uVar1 = (ulong)ptr & 3;
    if (uVar1 != 0) {
      memset(ptr,0,4 - uVar1);
      size = size - (4 - uVar1);
      ptr = (void *)((long)ptr + (4 - uVar1));
    }
    uVar1 = size & 0xfffffffffffffffc;
    memset(ptr,0,uVar1);
    size = size & 3;
    if (size != 0) {
      ptr = (void *)((long)ptr + uVar1);
      goto LAB_0011d873;
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_zero(void *ptr, nk_size size)
{
    NK_ASSERT(ptr);
    NK_MEMSET(ptr, 0, size);
}